

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLEScanState<int>::Skip(RLEScanState<int> *this,ColumnSegment *segment,idx_t skip_count)

{
  data_ptr_t pdVar1;
  
  pdVar1 = BufferHandle::Ptr(&this->handle);
  SkipInternal(this,(rle_count_t *)(pdVar1 + (ulong)this->rle_count_offset + segment->offset),
               skip_count);
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		auto data = handle.Ptr() + segment.GetBlockOffset();
		auto index_pointer = reinterpret_cast<rle_count_t *>(data + rle_count_offset);
		SkipInternal(index_pointer, skip_count);
	}